

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.h
# Opt level: O2

BinaryExpr<const_unsigned_char_&,_const_int_&> * __thiscall
Catch::ExprLhs<unsigned_char_const&>::operator==
          (BinaryExpr<const_unsigned_char_&,_const_int_&> *__return_storage_ptr__,
          ExprLhs<unsigned_char_const&> *this,int *rhs)

{
  byte bVar1;
  uint uVar2;
  byte *pbVar3;
  StringRef local_40;
  
  pbVar3 = *(byte **)this;
  bVar1 = *pbVar3;
  uVar2 = *rhs;
  StringRef::StringRef(&local_40,"==");
  (__return_storage_ptr__->super_ITransientExpression).m_isBinaryExpression = true;
  (__return_storage_ptr__->super_ITransientExpression).m_result = uVar2 == bVar1;
  (__return_storage_ptr__->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_001a4a78;
  __return_storage_ptr__->m_lhs = pbVar3;
  (__return_storage_ptr__->m_op).m_start = local_40.m_start;
  (__return_storage_ptr__->m_op).m_size = local_40.m_size;
  __return_storage_ptr__->m_rhs = rhs;
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }